

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.hpp
# Opt level: O0

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::~Field(Field<OpenMD::Vector3<double>_> *this)

{
  code *pcVar1;
  Field<OpenMD::Vector3<double>_> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Field() = default;